

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O1

int luaH_next(lua_State *L,Table *t,StkId key)

{
  Node *pNVar1;
  byte bVar2;
  uint uVar3;
  Node *n_;
  TValue *pTVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  TValue *io;
  byte *pbVar9;
  
  uVar3 = t->asize;
  if (((key->val).tt_ & 0xf) == 0) {
    uVar8 = 0;
  }
  else {
    uVar8 = 0;
    if (((key->val).tt_ == 3) &&
       (uVar8 = *(ulong *)key & 0xffffffff, (ulong)uVar3 <= *(ulong *)key - 1)) {
      uVar8 = 0;
    }
    if ((int)uVar8 == 0) {
      pTVar4 = getgeneric(t,&key->val,1);
      if (pTVar4->tt_ == ' ') {
        luaG_runerror(L,"invalid key to \'next\'");
      }
      uVar8 = (ulong)(uVar3 + (int)((ulong)((long)pTVar4 - (long)t->node) >> 3) * -0x55555555 + 1);
    }
  }
  uVar6 = (uint)uVar8;
  uVar7 = uVar6;
  if (uVar6 < uVar3) {
    lVar5 = uVar8 * -8;
    pbVar9 = (byte *)((long)t->array + uVar8 + 4);
    do {
      uVar6 = uVar6 + 1;
      bVar2 = *pbVar9;
      if ((bVar2 & 0xf) != 0) {
        *(long *)key = (long)(int)uVar6;
        (key->val).tt_ = '\x03';
        *(byte *)((long)key + 0x18) = bVar2;
        key[1].val.value_ = *(Value *)((long)t->array + lVar5 + -8);
        return 1;
      }
      lVar5 = lVar5 + -8;
      pbVar9 = pbVar9 + 1;
      uVar7 = uVar3;
    } while (uVar6 != uVar3);
  }
  uVar7 = uVar7 - uVar3;
  if (uVar7 >> (t->lsizenode & 0x1f) == 0) {
    do {
      if ((*(byte *)((long)t->node + (ulong)uVar7 * 0x18 + 8) & 0xf) != 0) {
        pNVar1 = t->node + uVar7;
        (key->val).value_ = (pNVar1->u).key_val;
        (key->val).tt_ = (pNVar1->u).key_tt;
        key[1].val.value_ = (pNVar1->u).value_;
        *(lu_byte *)((long)key + 0x18) = (pNVar1->u).tt_;
        return 1;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 >> (t->lsizenode & 0x1f) == 0);
  }
  return 0;
}

Assistant:

int luaH_next (lua_State *L, Table *t, StkId key) {
  unsigned int asize = t->asize;
  unsigned int i = findindex(L, t, s2v(key), asize);  /* find original key */
  for (; i < asize; i++) {  /* try first array part */
    lu_byte tag = *getArrTag(t, i);
    if (!tagisempty(tag)) {  /* a non-empty entry? */
      setivalue(s2v(key), cast_int(i) + 1);
      farr2val(t, i, tag, s2v(key + 1));
      return 1;
    }
  }
  for (i -= asize; i < sizenode(t); i++) {  /* hash part */
    if (!isempty(gval(gnode(t, i)))) {  /* a non-empty entry? */
      Node *n = gnode(t, i);
      getnodekey(L, s2v(key), n);
      setobj2s(L, key + 1, gval(n));
      return 1;
    }
  }
  return 0;  /* no more elements */
}